

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O2

VNode * despot::DESPOT::ConstructTree
                  (vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
                  RandomStreams *streams,ScenarioLowerBound *lower_bound,
                  ScenarioUpperBound *upper_bound,DSPOMDP *model,History *history,double timeout,
                  SearchStatistics *statistics)

{
  pointer ppSVar1;
  pointer ppSVar2;
  int iVar3;
  int iVar4;
  VNode *this;
  log_ostream *plVar5;
  clock_t cVar6;
  VNode *vnode;
  clock_t cVar7;
  clock_t cVar8;
  clock_t cVar9;
  long lVar10;
  uint uVar11;
  double dVar12;
  double dVar13;
  double local_80;
  
  if (statistics != (SearchStatistics *)0x0) {
    iVar3 = (*model->_vptr_DSPOMDP[0x18])(model);
    statistics->num_particles_before_search = iVar3;
  }
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  for (lVar10 = 0; (long)ppSVar2 - (long)ppSVar1 >> 3 != lVar10; lVar10 = lVar10 + 1) {
    ppSVar1[lVar10]->scenario_id = (int)lVar10;
  }
  this = (VNode *)operator_new(0x98);
  VNode::VNode(this,particles,0,(QNode *)0x0,0xffffffffffffffff);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (3 < iVar3) {
      plVar5 = logging::stream(4);
      std::operator<<(&plVar5->super_ostream,
                      "[DESPOT::ConstructTree] START - Initializing lower and upper bounds at the root node."
                     );
    }
  }
  InitBounds(this,lower_bound,upper_bound,streams,history);
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (3 < iVar3) {
      plVar5 = logging::stream(4);
      std::operator<<(&plVar5->super_ostream,
                      "[DESPOT::ConstructTree] END - Initializing lower and upper bounds at the root node."
                     );
    }
  }
  if (statistics != (SearchStatistics *)0x0) {
    dVar12 = VNode::lower_bound(this);
    statistics->initial_lb = dVar12;
    dVar12 = VNode::upper_bound(this);
    statistics->initial_ub = dVar12;
  }
  local_80 = 0.0;
  uVar11 = 2;
  do {
    cVar6 = clock();
    vnode = Trial(this,streams,lower_bound,upper_bound,model,history,statistics);
    cVar7 = clock();
    cVar8 = clock();
    Backup(vnode);
    if (statistics != (SearchStatistics *)0x0) {
      cVar9 = clock();
      statistics->time_backup =
           ((double)cVar9 - (double)cVar8) / 1000000.0 + statistics->time_backup;
    }
    cVar9 = clock();
    iVar3 = uVar11 - 1;
    local_80 = ((double)cVar9 - (double)cVar8) / 1000000.0 +
               local_80 + ((double)cVar7 - (double)cVar6) / 1000000.0;
    if (timeout <= ((double)uVar11 * local_80) / (double)iVar3) break;
    dVar12 = VNode::upper_bound(this);
    dVar13 = VNode::lower_bound(this);
    uVar11 = uVar11 + 1;
  } while (1e-06 < dVar12 - dVar13);
  if (statistics != (SearchStatistics *)0x0) {
    iVar4 = (*model->_vptr_DSPOMDP[0x18])(model);
    statistics->num_particles_after_search = iVar4;
    iVar4 = VNode::PolicyTreeSize(this);
    statistics->num_policy_nodes = iVar4;
    iVar4 = VNode::Size(this);
    statistics->num_tree_nodes = iVar4;
    dVar12 = VNode::lower_bound(this);
    statistics->final_lb = dVar12;
    dVar12 = VNode::upper_bound(this);
    statistics->final_ub = dVar12;
    statistics->time_search = local_80;
    statistics->num_trials = iVar3;
  }
  return this;
}

Assistant:

VNode* DESPOT::ConstructTree(vector<State*>& particles, RandomStreams& streams,
	ScenarioLowerBound* lower_bound, ScenarioUpperBound* upper_bound,
	const DSPOMDP* model, History& history, double timeout,
	SearchStatistics* statistics) {
	if (statistics != NULL) {
		statistics->num_particles_before_search = model->NumActiveParticles();
	}

	for (int i = 0; i < particles.size(); i++) {
		particles[i]->scenario_id = i;
	}

	VNode* root = new VNode(particles);

	logd
		<< "[DESPOT::ConstructTree] START - Initializing lower and upper bounds at the root node.";
	InitBounds(root, lower_bound, upper_bound, streams, history);
	logd
		<< "[DESPOT::ConstructTree] END - Initializing lower and upper bounds at the root node.";

	if (statistics != NULL) {
		statistics->initial_lb = root->lower_bound();
		statistics->initial_ub = root->upper_bound();
	}

	double used_time = 0;
	int num_trials = 0;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound, upper_bound, model, history, statistics);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		if (statistics != NULL) {
			statistics->time_backup += double(clock() - start) / CLOCKS_PER_SEC;
		}
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		num_trials++;
	} while (used_time * (num_trials + 1.0) / num_trials < timeout
		&& (root->upper_bound() - root->lower_bound()) > 1e-6);

	if (statistics != NULL) {
		statistics->num_particles_after_search = model->NumActiveParticles();
		statistics->num_policy_nodes = root->PolicyTreeSize();
		statistics->num_tree_nodes = root->Size();
		statistics->final_lb = root->lower_bound();
		statistics->final_ub = root->upper_bound();
		statistics->time_search = used_time;
		statistics->num_trials = num_trials;
	}

	return root;
}